

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw.c
# Opt level: O0

void raw_free(Backend *be)

{
  _Bool _Var1;
  Backend *ptr;
  Raw *raw;
  Backend *be_local;
  
  ptr = be + -5;
  _Var1 = is_tempseat((Seat *)be[-4].interactor);
  if (_Var1) {
    tempseat_free((Seat *)be[-4].interactor);
  }
  if (ptr->vt != (BackendVtable *)0x0) {
    sk_close((Socket *)ptr->vt);
  }
  conf_free((Conf *)be[-1].vt);
  safefree(be[-2].interactor);
  safefree(ptr);
  return;
}

Assistant:

static void raw_free(Backend *be)
{
    Raw *raw = container_of(be, Raw, backend);

    if (is_tempseat(raw->seat))
        tempseat_free(raw->seat);
    if (raw->s)
        sk_close(raw->s);
    conf_free(raw->conf);
    sfree(raw->description);
    sfree(raw);
}